

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::GetVectorOfNonStructAsNumpy
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *pIVar1;
  EnumDef *pEVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  EnumDef ***pppEVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  long *plVar8;
  EnumDef **ppEVar9;
  EnumDef *pEVar10;
  undefined8 uVar11;
  string local_150;
  string local_130;
  Type local_110;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  if (0xb < (field->value).type.element - BASE_TYPE_UTYPE) {
    return;
  }
  GenReceiver(this,struct_def,code_ptr);
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[4])(&local_130,pIVar1,field);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_150.field_2._M_allocated_capacity = *psVar7;
    local_150.field_2._8_8_ = plVar5[3];
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar7;
    local_150._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_150._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_150._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((field->value).type.base_type == BASE_TYPE_ARRAY) {
    GenIndents_abi_cxx11_(&local_130,this,2);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
    paVar3 = &local_150.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_150.field_2._M_allocated_capacity = *psVar7;
      local_150.field_2._8_8_ = plVar5[3];
      local_150._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar7;
      local_150._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_150._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_150._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar3) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    local_110.element = BASE_TYPE_NONE;
    local_110.base_type = (field->value).type.element;
    local_110.struct_def = (field->value).type.struct_def;
    local_110.enum_def = (field->value).type.enum_def;
    local_110.fixed_length = (field->value).type.fixed_length;
    GenTypeGet_abi_cxx11_(&local_130,this,&local_110);
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (&local_150,pIVar1,&local_130,(ulong)(this->namer_).super_Namer.config_.methods);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_150._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar3) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    NumToString<unsigned_short>(&local_50,(field->value).offset);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x370ec8);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar5;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
    pppEVar4 = (EnumDef ***)&local_110.enum_def;
    ppEVar9 = (EnumDef **)(plVar5 + 2);
    if ((EnumDef **)*plVar5 == ppEVar9) {
      local_110.enum_def = *ppEVar9;
      local_110._24_4_ = *(undefined4 *)(plVar5 + 3);
      local_110._28_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
      local_110._0_8_ = pppEVar4;
    }
    else {
      local_110.enum_def = *ppEVar9;
      local_110._0_8_ = (EnumDef **)*plVar5;
    }
    local_110.struct_def = (StructDef *)plVar5[1];
    *plVar5 = (long)ppEVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    (*(pIVar1->super_Namer)._vptr_Namer[4])(local_70,pIVar1,field);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x3898e6);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_c0 = *plVar8;
      lStack_b8 = plVar5[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar8;
      local_d0 = (long *)*plVar5;
    }
    local_c8 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_a0 = *plVar8;
      lStack_98 = plVar5[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar8;
      local_b0 = (long *)*plVar5;
    }
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    NumToString<std::__cxx11::string>(&local_f0,(flatbuffers *)&local_b0,local_a8);
    pEVar2 = (EnumDef *)
             ((long)&((local_110.struct_def)->super_Definition).name._M_dataplus._M_p +
             local_f0._M_string_length);
    pEVar10 = (EnumDef *)0xf;
    if ((EnumDef ***)local_110._0_8_ != pppEVar4) {
      pEVar10 = local_110.enum_def;
    }
    if (pEVar10 < pEVar2) {
      uVar11 = (EnumDef *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar11 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < pEVar2) goto LAB_0027cc61;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,local_110._0_8_);
    }
    else {
LAB_0027cc61:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0._M_dataplus._M_p);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    psVar7 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_130.field_2._M_allocated_capacity = *psVar7;
      local_130.field_2._8_8_ = puVar6[3];
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar7;
      local_130._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_130._M_string_length = puVar6[1];
    *puVar6 = psVar7;
    puVar6[1] = 0;
    *(undefined1 *)psVar7 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_150.field_2._M_allocated_capacity = *psVar7;
      local_150.field_2._8_8_ = plVar5[3];
      local_150._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar7;
      local_150._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_150._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_150._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar3) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,(ulong)(local_f0.field_2._M_allocated_capacity + 1))
      ;
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if ((EnumDef ***)local_110._0_8_ != pppEVar4) {
      operator_delete((void *)local_110._0_8_,
                      (ulong)((long)&((local_110.enum_def)->super_Definition).name._M_dataplus._M_p
                             + 1));
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0027ce26;
  }
  else {
    OffsetPrefix_abi_cxx11_(&local_150,this,field,false);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_150._M_dataplus._M_p);
    paVar3 = &local_150.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar3) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_150,this,3);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_150._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar3) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    GenTypeGet_abi_cxx11_(&local_130,this,&(field->value).type);
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (&local_150,pIVar1,&local_130,(ulong)(this->namer_).super_Namer.config_.methods);
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_150._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar3) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    GenIndents_abi_cxx11_(&local_130,this,2);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_150.field_2._M_allocated_capacity = *psVar7;
      local_150.field_2._8_8_ = plVar5[3];
      local_150._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar7;
      local_150._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_150._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_150._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar3) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_0027ce26;
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_0027ce26:
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

std::string EnumType(const EnumDef &enum_def, Imports *imports) const {
    imports->Import("typing");
    const Import &import =
        imports->Import(ModuleFor(&enum_def), namer_.Type(enum_def));

    std::string result = "";
    for (const EnumVal *val : enum_def.Vals()) {
      if (!result.empty()) result += ", ";
      result += import.name + "." + namer_.Variant(*val);
    }
    return "typing.Literal[" + result + "]";
  }